

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::load(File *this,string *fileName)

{
  pointer ppTVar1;
  Tag *pTVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  File *this_00;
  uint uVar7;
  ulong uVar8;
  ifstream file;
  byte abStack_390 [488];
  stringstream stream;
  
  std::ifstream::ifstream(&file,(fileName->_M_dataplus)._M_p,_S_in);
  if ((abStack_390[*(long *)(_file + -0x18)] & 5) == 0) {
    this_00 = (File *)&stream;
    std::__cxx11::stringstream::stringstream((stringstream *)this_00);
    file2StringStream(this_00,&file,&stream);
    uVar7 = 0;
    do {
      uVar8 = (ulong)uVar7;
      ppTVar1 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = (long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3;
      bVar6 = uVar5 <= uVar8;
      if (uVar5 <= uVar8) goto LAB_001065c8;
      pTVar2 = ppTVar1[uVar8];
      iVar3 = (*(pTVar2->super_StreamObject)._vptr_StreamObject[1])(pTVar2,&stream);
      uVar7 = uVar7 + 1;
    } while ((char)iVar3 != '\0');
    std::ifstream::close();
LAB_001065c8:
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: File \"");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    poVar4 = std::operator<<(poVar4,"\" doesn\'t exist!");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&file);
  return bVar6;
}

Assistant:

bool File::load( std::string fileName )
{
	bool success = true;

	std::ifstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: File \"" << fileName << "\" doesn't exist!" << std::endl;
		success = false;
        } else {

            std::stringstream stream;

            file2StringStream( file, stream );

            for ( unsigned int i = 0; i < elements().size();i++ ) {
		success = elements()[i]->read( stream );

		if ( !success )
		{
			file.close();
			break;
		}
            }
        }

	file.close();

	return success;
}